

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_MDAP(TT_ExecContext exc,FT_Long *args)

{
  ulong uVar1;
  ushort uVar2;
  FT_F26Dot6 FVar3;
  FT_F26Dot6 FVar4;
  FT_F26Dot6 local_30;
  FT_F26Dot6 distance;
  FT_F26Dot6 cur_dist;
  FT_UShort point;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = *args;
  uVar2 = (ushort)uVar1;
  if (uVar2 < (exc->zp0).n_points) {
    if ((exc->opcode & 1) == 0) {
      local_30 = 0;
    }
    else {
      FVar3 = (*exc->func_project)
                        (exc,(exc->zp0).cur[uVar1 & 0xffff].x,(exc->zp0).cur[uVar1 & 0xffff].y);
      FVar4 = (*exc->func_round)(exc,FVar3,3);
      local_30 = FVar4 - FVar3;
    }
    (*exc->func_move)(exc,&exc->zp0,uVar2,local_30);
    (exc->GS).rp0 = uVar2;
    (exc->GS).rp1 = uVar2;
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  return;
}

Assistant:

static void
  Ins_MDAP( TT_ExecContext  exc,
            FT_Long*        args )
  {
    FT_UShort   point;
    FT_F26Dot6  cur_dist;
    FT_F26Dot6  distance;


    point = (FT_UShort)args[0];

    if ( BOUNDS( point, exc->zp0.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      return;
    }

    if ( ( exc->opcode & 1 ) != 0 )
    {
      cur_dist = FAST_PROJECT( &exc->zp0.cur[point] );
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      if ( SUBPIXEL_HINTING_INFINALITY &&
           exc->ignore_x_mode          &&
           exc->GS.freeVector.x != 0   )
        distance = SUB_LONG( Round_None( exc, cur_dist, 3 ), cur_dist );
      else
#endif
        distance = SUB_LONG( exc->func_round( exc, cur_dist, 3 ), cur_dist );
    }
    else
      distance = 0;

    exc->func_move( exc, &exc->zp0, point, distance );

    exc->GS.rp0 = point;
    exc->GS.rp1 = point;
  }